

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::AddFixed32(UnknownFieldSet *this,int number,uint32_t value)

{
  pointer this_00;
  UnknownField *field;
  uint32_t value_local;
  int number_local;
  UnknownFieldSet *this_local;
  
  this_00 = RepeatedField<google::protobuf::UnknownField>::Add(&this->fields_);
  this_00->number_ = number;
  UnknownField::SetType(this_00,TYPE_FIXED32);
  (this_00->data_).fixed32 = value;
  return;
}

Assistant:

void UnknownFieldSet::AddFixed32(int number, uint32_t value) {
  auto& field = *fields_.Add();
  field.number_ = number;
  field.SetType(UnknownField::TYPE_FIXED32);
  field.data_.fixed32 = value;
}